

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::Parse(Parser *this,Tokenizer *input,FileDescriptorProto *file)

{
  ErrorCollector *pEVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  LogMessage *pLVar5;
  SourceCodeInfo *pSVar6;
  ulong uVar7;
  undefined8 *puVar8;
  byte bVar9;
  LocationRecorder *unaff_RBP;
  Arena *arena;
  LocationRecorder root_location;
  SourceCodeInfo source_code_info;
  LogFinisher local_b9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_b8;
  LocationRecorder local_b0;
  LogMessage local_98;
  SourceCodeInfo local_60;
  
  this->input_ = input;
  this->had_errors_ = false;
  (this->syntax_identifier_)._M_string_length = 0;
  *(this->syntax_identifier_)._M_dataplus._M_p = '\0';
  SourceCodeInfo::SourceCodeInfo(&local_60,(Arena *)0x0,false);
  this->source_code_info_ = &local_60;
  if ((this->input_->current_).type == TYPE_START) {
    io::Tokenizer::NextWithComments
              (this->input_,(string *)0x0,&this->upcoming_detached_comments_,
               &this->upcoming_doc_comments_);
  }
  LocationRecorder::LocationRecorder(&local_b0,this);
  LocationRecorder::RecordLegacyLocation(&local_b0,&file->super_Message,OTHER);
  if (this->require_syntax_identifier_ == false) {
    iVar4 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
    if (iVar4 == 0) goto LAB_00340a5d;
    if (this->stop_after_syntax_identifier_ == false) {
      internal::LogMessage::LogMessage
                (&local_98,LOGLEVEL_WARNING,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/parser.cc"
                 ,0x289);
      pLVar5 = internal::LogMessage::operator<<
                         (&local_98,"No syntax specified for the proto file: ");
      pLVar5 = internal::LogMessage::operator<<
                         (pLVar5,(string *)
                                 ((ulong)(file->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      pLVar5 = internal::LogMessage::operator<<(pLVar5,". Please use \'syntax = \"proto2\";\' ");
      pLVar5 = internal::LogMessage::operator<<
                         (pLVar5,"or \'syntax = \"proto3\";\' to specify a syntax ");
      pLVar5 = internal::LogMessage::operator<<(pLVar5,"version. (Defaulted to proto2 syntax.)");
      internal::LogFinisher::operator=(&local_b9,pLVar5);
      internal::LogMessage::~LogMessage(&local_98);
      std::__cxx11::string::_M_replace
                ((ulong)&this->syntax_identifier_,0,
                 (char *)(this->syntax_identifier_)._M_string_length,0x3f6dfb);
    }
LAB_00340a9a:
    if (this->stop_after_syntax_identifier_ == false) {
      bVar2 = true;
      if ((this->input_->current_).type != TYPE_END) {
        local_b8 = &this->upcoming_detached_comments_;
        unaff_RBP = &local_b0;
        do {
          bVar3 = ParseTopLevelStatement(this,file,unaff_RBP);
          if (!bVar3) {
            SkipStatement(this);
            iVar4 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
            if (iVar4 == 0) {
              local_98._0_8_ = (long)&local_98 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_98,"Unmatched \"}\".","");
              pEVar1 = this->error_collector_;
              if (pEVar1 != (ErrorCollector *)0x0) {
                (*pEVar1->_vptr_ErrorCollector[2])
                          (pEVar1,(ulong)(uint)(this->input_->current_).line,
                           (ulong)(uint)(this->input_->current_).column,&local_98);
              }
              this->had_errors_ = true;
              if (local_98._0_8_ != (long)&local_98 + 0x10U) {
                operator_delete((void *)local_98._0_8_);
              }
              io::Tokenizer::NextWithComments
                        (this->input_,(string *)0x0,local_b8,&this->upcoming_doc_comments_);
            }
          }
        } while ((this->input_->current_).type != TYPE_END);
      }
      goto LAB_00340b82;
    }
    unaff_RBP = (LocationRecorder *)(ulong)(this->had_errors_ ^ 1);
  }
  else {
LAB_00340a5d:
    bVar2 = ParseSyntaxIdentifier(this,&local_b0);
    if (bVar2) {
      if (file != (FileDescriptorProto *)0x0) {
        *(byte *)(file->_has_bits_).has_bits_ = (byte)(file->_has_bits_).has_bits_[0] | 4;
        uVar7 = (file->super_Message).super_MessageLite._internal_metadata_.ptr_;
        puVar8 = (undefined8 *)(uVar7 & 0xfffffffffffffffc);
        if ((uVar7 & 1) != 0) {
          puVar8 = (undefined8 *)*puVar8;
        }
        internal::ArenaStringPtr::Set(&file->syntax_,&this->syntax_identifier_,puVar8);
      }
      goto LAB_00340a9a;
    }
    unaff_RBP = (LocationRecorder *)0x0;
  }
  bVar2 = false;
LAB_00340b82:
  bVar9 = (byte)unaff_RBP;
  LocationRecorder::~LocationRecorder(&local_b0);
  if (bVar2) {
    this->input_ = (Tokenizer *)0x0;
    this->source_code_info_ = (SourceCodeInfo *)0x0;
    if (file == (FileDescriptorProto *)0x0) {
      __assert_fail("file != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/parser.cc"
                    ,0x2a4,
                    "bool google::protobuf::compiler::Parser::Parse(io::Tokenizer *, FileDescriptorProto *)"
                   );
    }
    *(byte *)(file->_has_bits_).has_bits_ = (byte)(file->_has_bits_).has_bits_[0] | 0x10;
    if (file->source_code_info_ == (SourceCodeInfo *)0x0) {
      uVar7 = (file->super_Message).super_MessageLite._internal_metadata_.ptr_;
      arena = (Arena *)(uVar7 & 0xfffffffffffffffc);
      if ((uVar7 & 1) != 0) {
        arena = *(Arena **)arena;
      }
      pSVar6 = Arena::CreateMaybeMessage<google::protobuf::SourceCodeInfo>(arena);
      file->source_code_info_ = pSVar6;
    }
    pSVar6 = file->source_code_info_;
    if (pSVar6 != &local_60) {
      if ((local_60.super_Message.super_MessageLite._internal_metadata_.ptr_ & 2U) == 0) {
        if ((local_60.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
          local_60.super_Message.super_MessageLite._internal_metadata_.ptr_ =
               *(ulong *)(local_60.super_Message.super_MessageLite._internal_metadata_.ptr_ &
                         0xfffffffffffffffc);
        }
      }
      else {
        local_60.super_Message.super_MessageLite._internal_metadata_.ptr_ = 0;
      }
      uVar7 = (pSVar6->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if ((uVar7 & 2) == 0) {
        if ((uVar7 & 1) != 0) {
          uVar7 = *(ulong *)(uVar7 & 0xfffffffffffffffc);
        }
      }
      else {
        uVar7 = 0;
      }
      if (local_60.super_Message.super_MessageLite._internal_metadata_.ptr_ == uVar7) {
        SourceCodeInfo::InternalSwap(&local_60,pSVar6);
      }
      else {
        internal::GenericSwap(&local_60.super_Message,&pSVar6->super_Message);
      }
    }
    bVar9 = this->had_errors_ ^ 1;
  }
  SourceCodeInfo::~SourceCodeInfo(&local_60);
  return (bool)(bVar9 & 1);
}

Assistant:

bool Parser::Parse(io::Tokenizer* input, FileDescriptorProto* file) {
  input_ = input;
  had_errors_ = false;
  syntax_identifier_.clear();

  // Note that |file| could be NULL at this point if
  // stop_after_syntax_identifier_ is true.  So, we conservatively allocate
  // SourceCodeInfo on the stack, then swap it into the FileDescriptorProto
  // later on.
  SourceCodeInfo source_code_info;
  source_code_info_ = &source_code_info;

  if (LookingAtType(io::Tokenizer::TYPE_START)) {
    // Advance to first token.
    input_->NextWithComments(NULL, &upcoming_detached_comments_,
                             &upcoming_doc_comments_);
  }

  {
    LocationRecorder root_location(this);
    root_location.RecordLegacyLocation(file,
                                       DescriptorPool::ErrorCollector::OTHER);

    if (require_syntax_identifier_ || LookingAt("syntax")) {
      if (!ParseSyntaxIdentifier(root_location)) {
        // Don't attempt to parse the file if we didn't recognize the syntax
        // identifier.
        return false;
      }
      // Store the syntax into the file.
      if (file != NULL) file->set_syntax(syntax_identifier_);
    } else if (!stop_after_syntax_identifier_) {
      GOOGLE_LOG(WARNING) << "No syntax specified for the proto file: " << file->name()
                   << ". Please use 'syntax = \"proto2\";' "
                   << "or 'syntax = \"proto3\";' to specify a syntax "
                   << "version. (Defaulted to proto2 syntax.)";
      syntax_identifier_ = "proto2";
    }

    if (stop_after_syntax_identifier_) return !had_errors_;

    // Repeatedly parse statements until we reach the end of the file.
    while (!AtEnd()) {
      if (!ParseTopLevelStatement(file, root_location)) {
        // This statement failed to parse.  Skip it, but keep looping to parse
        // other statements.
        SkipStatement();

        if (LookingAt("}")) {
          AddError("Unmatched \"}\".");
          input_->NextWithComments(NULL, &upcoming_detached_comments_,
                                   &upcoming_doc_comments_);
        }
      }
    }
  }

  input_ = NULL;
  source_code_info_ = NULL;
  assert(file != NULL);
  source_code_info.Swap(file->mutable_source_code_info());
  return !had_errors_;
}